

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

date_t __thiscall
duckdb::TimeBucket::OriginTernaryOperator::
Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>
          (OriginTernaryOperator *this,interval_t bucket_width,date_t ts,date_t origin,
          ValidityMask *mask,idx_t idx)

{
  TemplatedValidityMask<unsigned_long> *this_00;
  bool bVar1;
  BucketWidthType BVar2;
  date_t dVar3;
  NotImplementedException *this_01;
  int64_t extraout_RDX;
  undefined4 in_register_00000084;
  interval_t bucket_width_00;
  interval_t bucket_width_01;
  interval_t bucket_width_02;
  allocator local_51;
  string local_50;
  
  bucket_width_00._0_8_ = bucket_width._0_8_;
  this_00 = (TemplatedValidityMask<unsigned_long> *)CONCAT44(in_register_00000084,origin.days);
  bVar1 = Value::IsFinite<duckdb::date_t>(ts);
  if (!bVar1) {
    TemplatedValidityMask<unsigned_long>::SetInvalid(this_00,(idx_t)mask);
    return (date_t)0;
  }
  bucket_width_00.micros = extraout_RDX;
  BVar2 = ClassifyBucketWidthErrorThrow((TimeBucket *)this,bucket_width_00);
  if (BVar2 != CONVERTIBLE_TO_MONTHS) {
    if (BVar2 == CONVERTIBLE_TO_MICROS) {
      bucket_width_01.micros._4_4_ = 0;
      bucket_width_01._0_12_ = bucket_width._0_12_;
      dVar3 = OriginWidthConvertibleToMicrosTernaryOperator::
              Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>
                        ((OriginWidthConvertibleToMicrosTernaryOperator *)this,bucket_width_01,ts,
                         origin);
      return (date_t)dVar3.days;
    }
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_50,"Bucket type not implemented for TIME_BUCKET",&local_51);
    NotImplementedException::NotImplementedException(this_01,&local_50);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bucket_width_02.micros._4_4_ = 0;
  bucket_width_02._0_12_ = bucket_width._0_12_;
  dVar3 = OriginWidthConvertibleToMonthsTernaryOperator::
          Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>
                    ((OriginWidthConvertibleToMonthsTernaryOperator *)this,bucket_width_02,ts,origin
                    );
  return (date_t)dVar3.days;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC origin, ValidityMask &mask, idx_t idx) {
			if (!Value::IsFinite(origin)) {
				mask.SetInvalid(idx);
				return TR();
			}
			BucketWidthType bucket_width_type = ClassifyBucketWidthErrorThrow(bucket_width);
			switch (bucket_width_type) {
			case BucketWidthType::CONVERTIBLE_TO_MICROS:
				return OriginWidthConvertibleToMicrosTernaryOperator::Operation<TA, TB, TC, TR>(bucket_width, ts,
				                                                                                origin);
			case BucketWidthType::CONVERTIBLE_TO_MONTHS:
				return OriginWidthConvertibleToMonthsTernaryOperator::Operation<TA, TB, TC, TR>(bucket_width, ts,
				                                                                                origin);
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}